

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::CollectSideEffectsForTarget
          (cmComputeTargetDepends *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *visited,
          size_t depender_index)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  reference ppcVar3;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  reference this_02;
  size_t depender_index_00;
  size_t sVar4;
  reference this_03;
  iterator iVar5;
  iterator iVar6;
  reference __k;
  set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_04;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
  *it;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *__range3;
  value_type *dse;
  cmGraphEdge *edge;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  value_type *se;
  size_t depender_index_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *visited_local;
  cmComputeTargetDepends *this_local;
  
  se = (value_type *)depender_index;
  depender_index_local = (size_t)visited;
  visited_local =
       (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)this;
  sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (visited,(key_type *)&se);
  if (sVar2 == 0) {
    this_00 = std::
              vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
              ::operator[](&this->SideEffects,(size_type)se);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               depender_index_local,(value_type_conflict4 *)&se);
    ppcVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(size_type)se);
    cmGeneratorTarget::AppendCustomCommandSideEffects(*ppcVar3,&this_00->CustomCommandSideEffects);
    ppcVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(size_type)se);
    cmGeneratorTarget::AppendLanguageSideEffects(*ppcVar3,&this_00->LanguageSideEffects);
    this_01 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (&(this->InitialGraph).
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                          (size_type)se)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_01);
    edge = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                       *)&edge), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&__end2);
      sVar4 = depender_index_local;
      depender_index_00 = cmGraphEdge::operator_cast_to_unsigned_long(this_02);
      CollectSideEffectsForTarget
                (this,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)sVar4,depender_index_00);
      sVar4 = cmGraphEdge::operator_cast_to_unsigned_long(this_02);
      this_03 = std::
                vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ::operator[](&this->SideEffects,sVar4);
      iVar5 = std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::cbegin(&this_03->CustomCommandSideEffects);
      iVar6 = std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::cend(&this_03->CustomCommandSideEffects);
      std::
      set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::insert<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                ((set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)this_00,(_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)iVar5._M_node,
                 (_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)iVar6._M_node);
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
               ::begin(&this_03->LanguageSideEffects);
      it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
              ::end(&this_03->LanguageSideEffects);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&it), bVar1) {
        __k = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
              ::operator*(&__end3);
        this_04 = (set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                     ::operator[](&this_00->LanguageSideEffects,&__k->first);
        iVar5 = std::
                set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                ::cbegin(&__k->second);
        iVar6 = std::
                set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                ::cend(&__k->second);
        std::
        set<cmGeneratorTarget_const*,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::insert<std::_Rb_tree_const_iterator<cmGeneratorTarget_const*>>
                  (this_04,(_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)iVar5._M_node,
                   (_Rb_tree_const_iterator<const_cmGeneratorTarget_*>)iVar6._M_node);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffectsForTarget(
  std::set<size_t>& visited, size_t depender_index)
{
  if (!visited.count(depender_index)) {
    auto& se = this->SideEffects[depender_index];
    visited.insert(depender_index);
    this->Targets[depender_index]->AppendCustomCommandSideEffects(
      se.CustomCommandSideEffects);
    this->Targets[depender_index]->AppendLanguageSideEffects(
      se.LanguageSideEffects);

    for (auto const& edge : this->InitialGraph[depender_index]) {
      this->CollectSideEffectsForTarget(visited, edge);
      auto const& dse = this->SideEffects[edge];
      se.CustomCommandSideEffects.insert(dse.CustomCommandSideEffects.cbegin(),
                                         dse.CustomCommandSideEffects.cend());
      for (auto const& it : dse.LanguageSideEffects) {
        se.LanguageSideEffects[it.first].insert(it.second.cbegin(),
                                                it.second.cend());
      }
    }
  }
}